

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O1

void pnga_add(void *alpha,Integer g_a,void *beta,Integer g_b,Integer g_c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  double *pdVar10;
  Integer grp_id;
  Integer IVar11;
  Integer IVar12;
  logical lVar13;
  Integer IVar14;
  double *pdVar15;
  long icode;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  void *ptr_c;
  Integer ndim;
  Integer local_168;
  void *ptr_b;
  void *ptr_a;
  Integer local_150;
  long local_148;
  double *local_140;
  Integer typeC;
  Integer type;
  int local_124;
  double *local_120;
  Integer _lo [7];
  Integer _hi [7];
  Integer _ld [6];
  Integer _dims [7];
  
  iVar9 = _ga_sync_begin;
  local_124 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_140 = (double *)alpha;
  local_120 = (double *)beta;
  grp_id = pnga_get_pgroup(g_a);
  local_150 = g_b;
  IVar11 = pnga_get_pgroup(g_b);
  local_168 = g_c;
  IVar12 = pnga_get_pgroup(g_c);
  if (IVar12 != IVar11 || grp_id != IVar11) {
    pnga_error("All three arrays must be on same group for ga_add",0);
  }
  if (iVar9 != 0) {
    pnga_pgroup_sync(grp_id);
  }
  IVar12 = pnga_pgroup_nodeid(grp_id);
  IVar11 = local_150;
  lVar13 = pnga_compare_distr(g_a,local_150);
  if (((((lVar13 == 0) || (lVar13 = pnga_compare_distr(g_a,local_168), lVar13 == 0)) ||
       (lVar13 = pnga_has_ghosts(g_a), lVar13 != 0)) ||
      ((lVar13 = pnga_has_ghosts(IVar11), lVar13 != 0 ||
       (lVar13 = pnga_has_ghosts(local_168), lVar13 != 0)))) ||
     ((IVar14 = pnga_total_blocks(g_a), 0 < IVar14 ||
      ((IVar14 = pnga_total_blocks(IVar11), 0 < IVar14 ||
       (IVar14 = pnga_total_blocks(local_168), 0 < IVar14)))))) {
    pnga_inquire(g_a,&type,_ld,_dims);
    pnga_inquire(IVar11,&type,&ndim,_lo);
    pnga_inquire(IVar11,&type,&typeC,_hi);
    pnga_add_patch(local_140,g_a,one_arr,_dims,local_120,IVar11,one_arr,_lo,local_168,one_arr,_hi);
  }
  else {
    pnga_pgroup_sync(grp_id);
    IVar11 = local_168;
    pnga_inquire(local_168,&typeC,&ndim,_dims);
    pnga_distribution(IVar11,IVar12,_lo,_hi);
    if (_lo[0] < 1) {
      lVar16 = 0;
    }
    else {
      pnga_access_ptr(IVar11,_lo,_hi,&ptr_c,_ld);
      lVar16 = (_hi[ndim + -1] - _lo[ndim + -1]) + 1;
      if (1 < ndim) {
        lVar17 = 0;
        do {
          if (_ld[lVar17] != (_hi[lVar17] - _lo[lVar17]) + 1) {
            pnga_error("layout problem",lVar17);
          }
          lVar16 = lVar16 * ((_hi[lVar17] - _lo[lVar17]) + 1);
          lVar17 = lVar17 + 1;
        } while (lVar17 < ndim + -1);
      }
    }
    local_148 = lVar16;
    if (g_a == local_168) {
      ptr_a = ptr_c;
      IVar11 = local_150;
    }
    else {
      pnga_inquire(g_a,&type,&ndim,_dims);
      if (type != typeC) {
        pnga_error("types not consistent",g_a);
      }
      pnga_distribution(g_a,IVar12,_lo,_hi);
      IVar11 = local_150;
      if (_lo[0] < 1) {
        lVar16 = 0;
      }
      else {
        pnga_access_ptr(g_a,_lo,_hi,&ptr_a,_ld);
        lVar16 = (_hi[ndim + -1] - _lo[ndim + -1]) + 1;
        if (1 < ndim) {
          lVar17 = 0;
          do {
            if (_ld[lVar17] != (_hi[lVar17] - _lo[lVar17]) + 1) {
              pnga_error("layout problem",lVar17);
            }
            lVar16 = lVar16 * ((_hi[lVar17] - _lo[lVar17]) + 1);
            lVar17 = lVar17 + 1;
          } while (lVar17 < ndim + -1);
        }
      }
    }
    if (IVar11 == local_168) {
      ptr_b = ptr_c;
      pdVar15 = local_140;
      lVar17 = local_148;
    }
    else {
      pnga_inquire(IVar11,&type,&ndim,_dims);
      if (type != typeC) {
        pnga_error("types not consistent",IVar11);
      }
      pnga_distribution(IVar11,IVar12,_lo,_hi);
      pdVar15 = local_140;
      if (_lo[0] < 1) {
        lVar17 = 0;
      }
      else {
        pnga_access_ptr(IVar11,_lo,_hi,&ptr_b,_ld);
        lVar17 = (_hi[ndim + -1] - _lo[ndim + -1]) + 1;
        if (1 < ndim) {
          icode = 0;
          do {
            if (_ld[icode] != (_hi[icode] - _lo[icode]) + 1) {
              pnga_error("layout problem",icode);
            }
            lVar17 = lVar17 * ((_hi[icode] - _lo[icode]) + 1);
            icode = icode + 1;
          } while (icode < ndim + -1);
        }
      }
    }
    if (local_148 - lVar17 != 0) {
      pnga_error("inconsistent number of elements a",local_148 - lVar17);
    }
    pdVar10 = local_120;
    IVar11 = local_168;
    if (local_148 - lVar16 != 0) {
      pnga_error("inconsistent number of elements b",local_148 - lVar16);
    }
    if (0 < _lo[0]) {
      switch(type) {
      case 0x3e9:
        if (0 < local_148) {
          lVar16 = 0;
          do {
            *(int *)((long)ptr_c + lVar16 * 4) =
                 *(int *)((long)ptr_b + lVar16 * 4) * (int)*(float *)pdVar10 +
                 *(int *)((long)ptr_a + lVar16 * 4) * (int)*(float *)pdVar15;
            lVar16 = lVar16 + 1;
          } while (local_148 != lVar16);
        }
        break;
      case 0x3ea:
        if (0 < local_148) {
          lVar16 = 0;
          do {
            *(long *)((long)ptr_c + lVar16 * 8) =
                 *(long *)((long)ptr_b + lVar16 * 8) * (long)*pdVar10 +
                 *(long *)((long)ptr_a + lVar16 * 8) * (long)*pdVar15;
            lVar16 = lVar16 + 1;
          } while (local_148 != lVar16);
        }
        break;
      case 0x3eb:
        if (0 < local_148) {
          lVar16 = 0;
          do {
            *(float *)((long)ptr_c + lVar16 * 4) =
                 *(float *)pdVar15 * *(float *)((long)ptr_a + lVar16 * 4) +
                 *(float *)pdVar10 * *(float *)((long)ptr_b + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (local_148 != lVar16);
        }
        break;
      case 0x3ec:
        if (0 < local_148) {
          lVar16 = 0;
          do {
            *(double *)((long)ptr_c + lVar16 * 8) =
                 *pdVar15 * *(double *)((long)ptr_a + lVar16 * 8) +
                 *pdVar10 * *(double *)((long)ptr_b + lVar16 * 8);
            lVar16 = lVar16 + 1;
          } while (local_148 != lVar16);
        }
        break;
      case 0x3ee:
        if (0 < local_148) {
          lVar16 = 0;
          do {
            uVar1 = *(undefined8 *)((long)ptr_a + lVar16 * 8);
            uVar2 = *(undefined8 *)((long)ptr_b + lVar16 * 8);
            fVar18 = (float)uVar1;
            fVar19 = (float)((ulong)uVar1 >> 0x20);
            fVar20 = (float)uVar2;
            fVar21 = (float)((ulong)uVar2 >> 0x20);
            *(ulong *)((long)ptr_c + lVar16 * 8) =
                 CONCAT44(*(float *)((long)pdVar10 + 4) * fVar20 +
                          *(float *)pdVar10 * fVar21 +
                          *(float *)pdVar15 * fVar19 + fVar18 * *(float *)((long)pdVar15 + 4),
                          -*(float *)((long)pdVar10 + 4) * fVar21 +
                          *(float *)pdVar10 * fVar20 +
                          *(float *)pdVar15 * fVar18 + fVar19 * -*(float *)((long)pdVar15 + 4));
            lVar16 = lVar16 + 1;
          } while (local_148 != lVar16);
        }
        break;
      case 0x3ef:
        if (0 < local_148) {
          lVar17 = 0;
          lVar16 = local_148;
          do {
            dVar5 = *(double *)((long)ptr_a + lVar17);
            dVar6 = ((double *)((long)ptr_a + lVar17))[1];
            dVar7 = *(double *)((long)ptr_b + lVar17);
            dVar8 = ((double *)((long)ptr_b + lVar17))[1];
            dVar4 = pdVar10[1] * dVar7 + *pdVar10 * dVar8 + *pdVar15 * dVar6 + dVar5 * pdVar15[1];
            auVar3._8_4_ = SUB84(dVar4,0);
            auVar3._0_8_ = -pdVar10[1] * dVar8 +
                           *pdVar10 * dVar7 + *pdVar15 * dVar5 + dVar6 * -pdVar15[1];
            auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
            *(undefined1 (*) [16])((long)ptr_c + lVar17) = auVar3;
            lVar17 = lVar17 + 0x10;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        break;
      case 0x3f8:
        if (0 < local_148) {
          lVar16 = 0;
          do {
            *(long *)((long)ptr_c + lVar16 * 8) =
                 *(long *)((long)ptr_b + lVar16 * 8) * (long)*pdVar10 +
                 *(long *)((long)ptr_a + lVar16 * 8) * (long)*pdVar15;
            lVar16 = lVar16 + 1;
          } while (local_148 != lVar16);
        }
      }
      pnga_release_update(IVar11,_lo,_hi);
      if (g_a != IVar11) {
        pnga_release(g_a,_lo,_hi);
      }
      if (local_150 != IVar11) {
        pnga_release(local_150,_lo,_hi);
      }
    }
    if (local_124 != 0) {
      pnga_pgroup_sync(grp_id);
    }
  }
  return;
}

Assistant:

void pnga_add(void *alpha, Integer g_a, void* beta, Integer g_b, Integer g_c)
{
Integer  ndim, type, typeC, me, elems=0, elemsb=0, elemsa=0;
register Integer i;
void *ptr_a, *ptr_b, *ptr_c;
Integer a_grp, b_grp, c_grp;
int local_sync_begin,local_sync_end;
 
 Integer _dims[MAXDIM];
 Integer _ld[MAXDIM-1];
 Integer _lo[MAXDIM];
 Integer _hi[MAXDIM];
 Integer andim, adims[MAXDIM];
 Integer bndim, bdims[MAXDIM];
 Integer cndim, cdims[MAXDIM];
 
   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/

   a_grp = pnga_get_pgroup(g_a);
   b_grp = pnga_get_pgroup(g_b);
   c_grp = pnga_get_pgroup(g_c);
   if (a_grp != b_grp || b_grp != c_grp)
     pnga_error("All three arrays must be on same group for ga_add",0L);

   if(local_sync_begin)pnga_pgroup_sync(a_grp);

   me = pnga_pgroup_nodeid(a_grp);
   if((pnga_compare_distr(g_a,g_b) == FALSE) ||
      (pnga_compare_distr(g_a,g_c) == FALSE) ||
       pnga_has_ghosts(g_a) || pnga_has_ghosts(g_b) || pnga_has_ghosts(g_c) ||
       pnga_total_blocks(g_a) > 0 || pnga_total_blocks(g_b) > 0 ||
       pnga_total_blocks(g_c) > 0) {
       /* distributions not identical */
       pnga_inquire(g_a, &type, &andim, adims);
       pnga_inquire(g_b, &type, &bndim, bdims);
       pnga_inquire(g_b, &type, &cndim, cdims);

       pnga_add_patch(alpha, g_a, one_arr, adims, beta, g_b, one_arr, bdims,
                      g_c, one_arr, cdims);
       
       return;
   }

   pnga_pgroup_sync(a_grp);
   pnga_inquire(g_c,  &typeC, &ndim, _dims);
   pnga_distribution(g_c, me, _lo, _hi);
   if (  _lo[0]>0 ){
     pnga_access_ptr(g_c, _lo, _hi, &ptr_c, _ld);
     GET_ELEMS(ndim,_lo,_hi,_ld,&elems);
   }

   if(g_a == g_c){
     ptr_a  = ptr_c;
     elemsa = elems;
   }else { 
     pnga_inquire(g_a,  &type, &ndim, _dims);
     if(type != typeC) pnga_error("types not consistent", g_a);
     pnga_distribution(g_a, me, _lo, _hi);
     if (  _lo[0]>0 ){
       pnga_access_ptr(g_a, _lo, _hi, &ptr_a, _ld);
       GET_ELEMS(ndim,_lo,_hi,_ld,&elemsa);
     }
   }

   if(g_b == g_c){
     ptr_b  = ptr_c;
     elemsb = elems;
   }else {
     pnga_inquire(g_b,  &type, &ndim, _dims);
     if(type != typeC) pnga_error("types not consistent", g_b);
     pnga_distribution(g_b, me, _lo, _hi);
     if (  _lo[0]>0 ){
       pnga_access_ptr(g_b, _lo, _hi, &ptr_b, _ld);
       GET_ELEMS(ndim,_lo,_hi,_ld,&elemsb);
     }
   }

   if(elems!= elemsb)pnga_error("inconsistent number of elements a",elems-elemsb);
   if(elems!= elemsa)pnga_error("inconsistent number of elements b",elems-elemsa);

   if (  _lo[0]>0 ){

       /* operation on the "local" piece of data */
       switch(type){
         int *ia, *ib, *ic;
         double *da,*db,*dc;
         float *fa, *fb, *fc;
         long *la,*lb,*lc;
         long long *lla,*llb,*llc;
         case C_DBL:
                  da = (double*)ptr_a;
                  db = (double*)ptr_b;
                  dc = (double*)ptr_c;
                  for(i=0; i<elems; i++)
                      dc[i] = *(double*)alpha *da[i] +
                              *(double*)beta * db[i];
              break;
         case C_DCPL:
                  for(i=0; i<elems; i++){
                     DoubleComplex a = ((DoubleComplex*)ptr_a)[i];
                     DoubleComplex b = ((DoubleComplex*)ptr_b)[i];
                     DoubleComplex *ac = (DoubleComplex*)ptr_c;
                     DoubleComplex x= *(DoubleComplex*)alpha;
                     DoubleComplex y= *(DoubleComplex*)beta;
                     /* c = x*a + y*b */
                     ac[i].real = x.real*a.real - 
                              x.imag*a.imag + y.real*b.real - y.imag*b.imag;
                     ac[i].imag = x.real*a.imag + 
                              x.imag*a.real + y.real*b.imag + y.imag*b.real;
                  }
              break;
         case C_SCPL:
                  for(i=0; i<elems; i++){
                     SingleComplex a = ((SingleComplex*)ptr_a)[i];
                     SingleComplex b = ((SingleComplex*)ptr_b)[i];
                     SingleComplex *ac = (SingleComplex*)ptr_c;
                     SingleComplex x= *(SingleComplex*)alpha;
                     SingleComplex y= *(SingleComplex*)beta;
                     /* c = x*a + y*b */
                     ac[i].real = x.real*a.real - 
                              x.imag*a.imag + y.real*b.real - y.imag*b.imag;
                     ac[i].imag = x.real*a.imag + 
                              x.imag*a.real + y.real*b.imag + y.imag*b.real;
                  }
              break;
         case C_FLOAT:
                  fa = (float*)ptr_a;
                  fb = (float*)ptr_b;
                  fc = (float*)ptr_c;
                  for(i=0; i<elems; i++)
                      fc[i] = *(float*)alpha *fa[i] + *(float*)beta *fb[i]; 
              break;
         case C_INT:
                  ia = (int*)ptr_a;
                  ib = (int*)ptr_b;
                  ic = (int*)ptr_c;
                  for(i=0; i<elems; i++) 
                      ic[i] = *(int*)alpha *ia[i] + *(int*)beta *ib[i];
              break;    
         case C_LONG:
                  la = (long*)ptr_a;
		  lb = (long*)ptr_b;
		  lc = (long*)ptr_c;
                  for(i=0; i<elems; i++)
                      lc[i] = *(long*)alpha *la[i] + *(long*)beta *lb[i];
              break;
         case C_LONGLONG:
                  lla = (long long*)ptr_a;
		  llb = (long long*)ptr_b;
		  llc = (long long*)ptr_c;
                  for(i=0; i<elems; i++)
                      llc[i] = ( *(long long*)alpha *lla[i] +
                                 *(long long*)beta  * llb[i] );
                
       }

       /* release access to the data */
       pnga_release_update(g_c, _lo, _hi);
       if(g_c != g_a)pnga_release(g_a, _lo, _hi);
       if(g_c != g_b)pnga_release(g_b, _lo, _hi);
   }


   if(local_sync_end)pnga_pgroup_sync(a_grp);
}